

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O3

void * __thiscall
cbtHashedOverlappingPairCache::removeOverlappingPair
          (cbtHashedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          ,cbtDispatcher *dispatcher)

{
  long lVar1;
  cbtBroadphasePair *pcVar2;
  int *piVar3;
  void *pvVar4;
  cbtOverlappingPairCallback *pcVar5;
  cbtCollisionAlgorithm *pcVar6;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar7;
  uint uVar8;
  int iVar9;
  cbtBroadphaseProxy *pcVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  cbtBroadphasePair *pcVar16;
  
  pcVar10 = proxy0;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pcVar10 = proxy1;
    proxy1 = proxy0;
  }
  uVar8 = proxy1->m_uniqueId << 0x10 | pcVar10->m_uniqueId;
  uVar8 = ~(uVar8 << 0xf) + uVar8;
  uVar8 = (uVar8 >> 10 ^ uVar8) * 9;
  uVar8 = uVar8 >> 6 ^ uVar8;
  uVar8 = ~(uVar8 << 0xb) + uVar8;
  uVar14 = (long)(int)(uVar8 >> 0x10 ^ uVar8) & (long)(this->m_overlappingPairArray).m_capacity - 1U
  ;
  iVar13 = (this->m_hashTable).m_data[uVar14];
  if (iVar13 != -1) {
    pcVar2 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pcVar2[iVar13].m_pProxy0)->m_uniqueId == pcVar10->m_uniqueId) &&
         (pcVar16 = pcVar2 + iVar13, pcVar16->m_pProxy1->m_uniqueId == proxy1->m_uniqueId)) {
        (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
          _vptr_cbtOverlappingPairCallback[8])(this,pcVar16,dispatcher);
        piVar3 = (this->m_hashTable).m_data;
        pvVar4 = (pcVar16->field_3).m_internalInfo1;
        iVar13 = piVar3[uVar14];
        iVar15 = (int)((ulong)((long)pcVar16 - (long)(this->m_overlappingPairArray).m_data) >> 5);
        if (iVar13 == iVar15) goto LAB_008a1c11;
        do {
          iVar9 = iVar13;
          iVar13 = (this->m_next).m_data[iVar9];
        } while (iVar13 != iVar15);
        if (iVar9 == -1) {
LAB_008a1c11:
          piVar3[uVar14] = (this->m_next).m_data[iVar15];
        }
        else {
          piVar3 = (this->m_next).m_data;
          piVar3[iVar9] = piVar3[iVar15];
        }
        lVar12 = (long)(this->m_overlappingPairArray).m_size;
        pcVar5 = this->m_ghostPairCallback;
        lVar1 = lVar12 + -1;
        if (pcVar5 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar5->_vptr_cbtOverlappingPairCallback[3])(pcVar5,pcVar10,proxy1,dispatcher);
        }
        iVar13 = (int)lVar1;
        if (iVar13 == iVar15) goto LAB_008a1d0d;
        pcVar16 = (this->m_overlappingPairArray).m_data;
        piVar3 = (this->m_hashTable).m_data;
        pcVar2 = pcVar16 + lVar1;
        uVar8 = (pcVar16[lVar1].m_pProxy1)->m_uniqueId << 0x10 |
                (pcVar16[lVar1].m_pProxy0)->m_uniqueId;
        uVar8 = ~(uVar8 << 0xf) + uVar8;
        uVar8 = (uVar8 >> 10 ^ uVar8) * 9;
        uVar8 = uVar8 >> 6 ^ uVar8;
        uVar8 = ~(uVar8 << 0xb) + uVar8;
        uVar14 = (long)(int)(uVar8 >> 0x10 ^ uVar8) &
                 (long)(this->m_overlappingPairArray).m_capacity - 1U;
        iVar9 = piVar3[uVar14];
        if (iVar9 == iVar13) {
LAB_008a1cdc:
          piVar3[uVar14] = (this->m_next).m_data[lVar12 + -1];
        }
        else {
          do {
            iVar11 = iVar9;
            iVar9 = (this->m_next).m_data[iVar11];
          } while (iVar9 != iVar13);
          if (iVar11 == -1) goto LAB_008a1cdc;
          piVar3 = (this->m_next).m_data;
          piVar3[iVar11] = piVar3[lVar12 + -1];
        }
        pcVar10 = pcVar2->m_pProxy1;
        pcVar6 = pcVar2->m_algorithm;
        aVar7 = pcVar2->field_3;
        pcVar16 = pcVar16 + iVar15;
        pcVar16->m_pProxy0 = pcVar2->m_pProxy0;
        pcVar16->m_pProxy1 = pcVar10;
        pcVar16->m_algorithm = pcVar6;
        pcVar16->field_3 = aVar7;
        piVar3 = (this->m_hashTable).m_data;
        (this->m_next).m_data[iVar15] = piVar3[uVar14];
        piVar3[uVar14] = iVar15;
LAB_008a1d0d:
        piVar3 = &(this->m_overlappingPairArray).m_size;
        *piVar3 = *piVar3 + -1;
        return pvVar4;
      }
      iVar13 = (this->m_next).m_data[iVar13];
    } while (iVar13 != -1);
  }
  return (void *)0x0;
}

Assistant:

void* cbtHashedOverlappingPairCache::removeOverlappingPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1, cbtDispatcher* dispatcher)
{
	if (proxy0->m_uniqueId > proxy1->m_uniqueId)
		cbtSwap(proxy0, proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2)
		cbtSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));

	cbtBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair, dispatcher);

	void* userData = pair->m_internalInfo1;

	cbtAssert(pair->m_pProxy0->getUid() == proxyId1);
	cbtAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	cbtAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	cbtAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1, dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const cbtBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
	/* missing swap here too, Nat. */
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity() - 1));

	index = m_hashTable[lastHash];
	cbtAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}